

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O0

wasm_u16_t setup_params(wasmbox_mutable_function_t *func,wasmbox_type_t *type)

{
  wasm_u16_t wVar1;
  wasm_u16_t wVar2;
  wasm_s16_t wVar3;
  int local_20;
  int i;
  wasm_u16_t argument_to;
  wasm_u16_t stack_top;
  wasmbox_type_t *type_local;
  wasmbox_mutable_function_t *func_local;
  
  wVar1 = func->stack_top;
  wVar2 = type->return_size;
  for (local_20 = 0; local_20 < (int)(uint)type->argument_size; local_20 = local_20 + 1) {
    wVar3 = wasmbox_function_pop_stack(func);
    wasmbox_code_add_move(func,(int)wVar3,(uint)(ushort)(wVar1 + wVar2 + 2) + local_20);
  }
  return wVar1;
}

Assistant:

static wasm_u16_t setup_params(wasmbox_mutable_function_t *func,
                               wasmbox_type_t *type) {
  wasm_u16_t stack_top = func->stack_top;
  wasm_u16_t argument_to =
      stack_top + type->return_size + WASMBOX_FUNCTION_CALL_OFFSET;
  for (int i = 0; i < type->argument_size; ++i) {
    wasmbox_code_add_move(func, wasmbox_function_pop_stack(func),
                          argument_to + i);
  }
  return stack_top;
}